

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O1

bool __thiscall PDA::evaluate(PDA *this,string *s)

{
  char input;
  State *pSVar1;
  size_type sVar2;
  bool bVar3;
  size_type sVar4;
  PDA *this_00;
  initializer_list<EvaluationState> __l;
  vector<EvaluationState,_std::allocator<EvaluationState>_> evaluations;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  stack;
  allocator_type local_199;
  undefined1 local_198 [112];
  EvaluationState local_128;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_d0;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_b8;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_a0;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  local_198._0_8_ = (pointer)0x0;
  local_198._8_8_ = (pointer)0x0;
  local_198._16_8_ = (pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_88,0);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88,&this->startStackZ0);
  pSVar1 = this->startState;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_128,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_88);
  __l._M_len = 1;
  __l._M_array = &local_128;
  local_128.currentStates = pSVar1;
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_198 + 0x58),__l,
             &local_199);
  local_198._24_8_ = this;
  eclose(&local_a0,this,
         (vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_198 + 0x58));
  local_198._48_8_ = local_198._16_8_;
  local_198._40_8_ = local_198._8_8_;
  local_198._32_8_ = local_198._0_8_;
  local_198._0_8_ =
       local_a0.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_198._8_8_ =
       local_a0.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_198._16_8_ =
       local_a0.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a0.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_198 + 0x20));
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_a0);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_198 + 0x58));
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_128);
  sVar2 = s->_M_string_length;
  if (sVar2 != 0) {
    local_198._56_8_ = (s->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      input = *(char *)((long)&((_Alloc_hider *)local_198._56_8_)->_M_p + sVar4);
      this_00 = (PDA *)local_198;
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
                (&local_d0,(vector<EvaluationState,_std::allocator<EvaluationState>_> *)this_00);
      nextEvaluations(&local_b8,this_00,&local_d0,input);
      eclose((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_198 + 0x20),
             (PDA *)local_198._24_8_,&local_b8);
      local_128.stack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)local_198._16_8_;
      local_128.stack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size = local_198._8_8_;
      local_128.stack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)local_198._0_8_;
      local_198._0_8_ = local_198._32_8_;
      local_198._8_8_ = local_198._40_8_;
      local_198._16_8_ = local_198._48_8_;
      local_198._32_8_ = (pointer)0x0;
      local_198._40_8_ = (pointer)0x0;
      local_198._48_8_ = (pointer)0x0;
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
                ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&local_128);
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
                ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_198 + 0x20));
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_b8);
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_d0);
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_198 + 0x40),
             (vector<EvaluationState,_std::allocator<EvaluationState>_> *)local_198);
  bVar3 = containsEndState((PDA *)local_198._24_8_,
                           (vector<EvaluationState,_std::allocator<EvaluationState>_> *)
                           (local_198 + 0x40));
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_198 + 0x40));
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)local_198);
  return bVar3;
}

Assistant:

bool PDA::evaluate(std::string s) {

    std::vector<EvaluationState> evaluations;

    std::stack<std::string> stack;
    stack.push(startStackZ0);

    evaluations = eclose({EvaluationState(stack, startState)});

    for (char c: s) {
        evaluations = eclose(nextEvaluations(evaluations, c));
    }

    return containsEndState(evaluations);
}